

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InvertDatabase.h
# Opt level: O0

void __thiscall InvertDatabase::init_buffer(InvertDatabase *this,int num_class,int size)

{
  element_type *peVar1;
  element_type *this_00;
  reference pvVar2;
  int local_38 [2];
  undefined1 local_30 [8];
  Itemset_S tmp;
  int i;
  int iStack_14;
  bool print_idlist;
  int size_local;
  int num_class_local;
  InvertDatabase *this_local;
  
  iStack_14 = num_class;
  _size_local = this;
  std::vector<std::shared_ptr<Itemset>,_std::allocator<std::shared_ptr<Itemset>_>_>::reserve
            (&this->_items,(long)size);
  peVar1 = std::__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->args);
  tmp.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ =
       peVar1->print_tidlist != '\0';
  for (tmp.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 0;
      (int)tmp.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi < size;
      tmp.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ =
           (int)tmp.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 1) {
    local_38[1] = 1;
    local_38[0] = 0;
    std::make_shared<Itemset,int,int,int&,bool&>
              ((int *)local_30,local_38 + 1,local_38,(bool *)&stack0xffffffffffffffec);
    this_00 = std::__shared_ptr_access<Itemset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<Itemset,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                         local_30);
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&this->backidx,
                        (long)(int)tmp.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount._M_pi);
    Itemset::setitem(this_00,0,*pvVar2);
    std::vector<std::shared_ptr<Itemset>,_std::allocator<std::shared_ptr<Itemset>_>_>::push_back
              (&this->_items,(value_type *)local_30);
    std::shared_ptr<Itemset>::~shared_ptr((shared_ptr<Itemset> *)local_30);
  }
  return;
}

Assistant:

void init_buffer(int num_class, int size) {
        _items.reserve(size);
        bool print_idlist = args->print_tidlist;

        for (int i = 0; i < size; i++) {
            Itemset_S tmp = make_shared<Itemset>(1, 0, num_class, print_idlist);
            tmp->setitem(0, backidx[i]);
            _items.push_back(tmp);
        }
    }